

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_init(mp_int *a)

{
  void *pvVar1;
  undefined4 *in_RDI;
  int i;
  int local_14;
  int local_4;
  
  pvVar1 = malloc(0x100);
  *(void **)(in_RDI + 4) = pvVar1;
  if (*(long *)(in_RDI + 4) == 0) {
    local_4 = -2;
  }
  else {
    for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 4) + (long)local_14 * 8) = 0;
    }
    *in_RDI = 0;
    in_RDI[1] = 0x20;
    in_RDI[2] = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_init (mp_int * a)
{
  int i;

  /* allocate memory required and clear it */
  a->dp = OPT_CAST(mp_digit) XMALLOC (sizeof (mp_digit) * MP_PREC);
  if (a->dp == NULL) {
    return MP_MEM;
  }

  /* set the digits to zero */
  for (i = 0; i < MP_PREC; i++) {
      a->dp[i] = 0;
  }

  /* set the used to zero, allocated digits to the default precision
   * and sign to positive */
  a->used  = 0;
  a->alloc = MP_PREC;
  a->sign  = MP_ZPOS;

  return MP_OKAY;
}